

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CreateIndex(Parse *pParse,Token *pName1,Token *pName2,SrcList *pTblName,ExprList *pList,
                       int onError,Token *pStart,Expr *pPIWhere,int sortOrder,int ifNotExist,
                       u8 idxType)

{
  byte *pbVar1;
  byte bVar2;
  u16 uVar3;
  short sVar4;
  ushort uVar5;
  sqlite3 *db;
  i16 *piVar6;
  i16 *piVar7;
  bool bVar8;
  u8 uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  Table *pTVar14;
  char *zName;
  Index *pIVar15;
  Table *pTVar16;
  Expr *pEVar17;
  size_t sVar18;
  Expr *pEVar19;
  ExprList_item *pEVar20;
  ExprList *pEVar21;
  CollSeq *pCVar22;
  ulong uVar23;
  void *pvVar24;
  Index *pIVar25;
  Op *pOVar26;
  int iVar27;
  Schema **ppSVar28;
  Db *pDVar29;
  char *pcVar30;
  char *pcVar31;
  short *psVar32;
  long lVar33;
  Index *pIVar34;
  Vdbe *local_e8;
  char *local_e0;
  ExprList_item *local_d0;
  ExprList *local_c8;
  char *local_b8;
  int local_b0;
  char *zExtra;
  Token *pName;
  long local_80;
  Token *local_78;
  Token prevCol;
  DbFixer sFix;
  
  db = pParse->db;
  zName = (char *)0x0;
  pName = (Token *)0x0;
  zExtra = (char *)0x0;
  local_c8 = pList;
  if (db->mallocFailed != '\0') goto LAB_0014de6c;
  if ((0 < pParse->nErr) ||
     (((idxType != '\x02' && (pParse->declareVtab != '\0')) ||
      (iVar10 = sqlite3ReadSchema(pParse), iVar10 != 0)))) {
LAB_0014de69:
    zName = (char *)0x0;
    goto LAB_0014de6c;
  }
  if (pTblName == (SrcList *)0x0) {
    pTVar14 = pParse->pNewTable;
    if (pTVar14 == (Table *)0x0) goto LAB_0014de69;
    uVar23 = 0;
    if (pTVar14->pSchema == (Schema *)0x0) {
      uVar23 = 0xfff0bdc0;
LAB_0014e04a:
      uVar11 = (uint)uVar23;
      pIVar34 = (Index *)0x0;
    }
    else {
      uVar11 = db->nDb;
      if ((int)uVar11 < 1) goto LAB_0014e04a;
      ppSVar28 = &db->aDb->pSchema;
      uVar23 = 0;
      do {
        if (*ppSVar28 == pTVar14->pSchema) goto LAB_0014e04a;
        uVar23 = uVar23 + 1;
        ppSVar28 = ppSVar28 + 4;
      } while (uVar11 != uVar23);
      pIVar34 = (Index *)0x0;
    }
LAB_0014e04d:
    local_80 = (long)(int)uVar11 * 0x20;
    pDVar29 = db->aDb + (int)uVar11;
    pcVar31 = pTVar14->zName;
    iVar10 = sqlite3_strnicmp(pcVar31,"sqlite_",7);
    if (((iVar10 == 0) && ((db->init).busy == '\0')) &&
       (iVar10 = sqlite3_strnicmp(pcVar31 + 7,"altertab_",9), iVar10 != 0)) {
      pcVar30 = "table %s may not be indexed";
      goto LAB_0014e0e8;
    }
    if (pTVar14->pSelect == (Select *)0x0) {
      if (pTVar14->nModuleArg != 0) {
        pcVar31 = "virtual tables may not be indexed";
        goto LAB_0014e0a8;
      }
      local_78 = pName;
      if (pName == (Token *)0x0) {
        for (pIVar15 = pTVar14->pIndex; pIVar15 != (Index *)0x0; pIVar15 = pIVar15->pNext) {
        }
        pIVar15 = (Index *)0x0;
        zName = sqlite3MPrintf(db,"sqlite_autoindex_%s_%d",pcVar31);
        if (zName == (char *)0x0) goto LAB_0014de6f;
        if (pParse->declareVtab != '\0') {
          zName[7] = zName[7] + '\x01';
        }
LAB_0014e1ca:
        pcVar31 = pDVar29->zDbSName;
        pcVar30 = "sqlite_master";
        if (uVar11 == 1) {
          pcVar30 = "sqlite_temp_master";
        }
        pIVar15 = (Index *)0x0;
        iVar10 = sqlite3AuthCheck(pParse,0x12,pcVar30,(char *)0x0,pcVar31);
        if (iVar10 != 0) goto LAB_0014de6f;
        iVar10 = sqlite3AuthCheck(pParse,(uint)(uVar11 == 1) * 2 + 1,zName,pTVar14->zName,pcVar31);
        if (iVar10 != 0) goto LAB_0014de6c;
        if (pList == (ExprList *)0x0) {
          prevCol.z = pTVar14->aCol[(long)pTVar14->nCol + -1].zName;
          if (prevCol.z == (char *)0x0) {
            prevCol.n = 0;
          }
          else {
            sVar18 = strlen(prevCol.z);
            prevCol.n = (uint)sVar18 & 0x3fffffff;
          }
          pEVar17 = sqlite3ExprAlloc(db,0x1b,&prevCol,0);
          local_c8 = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pEVar17);
          if (-1 < sortOrder && local_c8 != (ExprList *)0x0) {
            local_c8->a[(long)local_c8->nExpr + -1].sortOrder = (u8)sortOrder;
          }
          if (local_c8 == (ExprList *)0x0) goto LAB_0014de6c;
        }
        else if (pParse->db->aLimit[2] < pList->nExpr) {
          sqlite3ErrorMsg(pParse,"too many columns in %s","index");
        }
        iVar10 = local_c8->nExpr;
        uVar3 = 1;
        iVar27 = 1;
        if (0 < (long)iVar10) {
          lVar33 = 0;
          iVar27 = 0;
          do {
            pcVar31 = *(char **)((long)&local_c8->a[0].pExpr + lVar33);
            if (*pcVar31 == '^') {
              pcVar31 = *(char **)(pcVar31 + 8);
              if (pcVar31 == (char *)0x0) {
                iVar12 = 1;
              }
              else {
                sVar18 = strlen(pcVar31);
                iVar12 = ((uint)sVar18 & 0x3fffffff) + 1;
              }
              iVar27 = iVar27 + iVar12;
            }
            lVar33 = lVar33 + 0x20;
          } while ((long)iVar10 << 5 != lVar33);
          iVar27 = iVar27 + 1;
        }
        sVar18 = strlen(zName);
        uVar13 = (uint)sVar18 & 0x3fffffff;
        if (pIVar34 != (Index *)0x0) {
          uVar3 = pIVar34->nKeyCol;
        }
        pIVar15 = sqlite3AllocateIndexObject(db,(short)iVar10 + uVar3,iVar27 + uVar13,&zExtra);
        pcVar31 = zExtra;
        if (db->mallocFailed != '\0') goto LAB_0014de6f;
        pIVar15->zName = zExtra;
        local_b8 = zExtra + (ulong)uVar13 + 1;
        zExtra = local_b8;
        memcpy(pcVar31,zName,(ulong)uVar13 + 1);
        pIVar15->pTable = pTVar14;
        pIVar15->onError = (u8)onError;
        pIVar15->field_0x63 = idxType & 3 | (onError != 0) << 3 | pIVar15->field_0x63 & 0xf4;
        pIVar15->pSchema = *(Schema **)((long)&db->aDb->pSchema + local_80);
        pIVar15->nKeyCol = (u16)local_c8->nExpr;
        if (pPIWhere != (Expr *)0x0) {
          sqlite3ResolveSelfReference(pParse,pTVar14,2,pPIWhere,(ExprList *)0x0);
          pIVar15->pPartIdxWhere = pPIWhere;
        }
        if (local_c8->nExpr < 1) {
          local_e8 = (Vdbe *)0x0;
        }
        else {
          bVar2 = pDVar29->pSchema->file_format;
          local_d0 = local_c8->a;
          pPIWhere = (Expr *)0x0;
          local_e8 = (Vdbe *)0x0;
          do {
            pEVar17 = local_d0->pExpr;
            pEVar19 = pEVar17;
            if ((pEVar17->op == 'a') ||
               ((pEVar17->op == '^' && (pEVar19 = pEVar17->pLeft, pEVar19->op == 'a')))) {
              pEVar19->op = '\x1b';
            }
            sqlite3ResolveSelfReference(pParse,pTVar14,0x20,pEVar17,(ExprList *)0x0);
            pEVar20 = local_d0;
            if (pParse->nErr == 0) {
              while ((pEVar17 = pEVar20->pExpr, pEVar17 != (Expr *)0x0 &&
                     ((pEVar17->flags >> 0xc & 1) != 0))) {
                if ((pEVar17->flags >> 0x12 & 1) == 0) {
                  pEVar20 = (ExprList_item *)&pEVar17->pLeft;
                }
                else {
                  pEVar20 = ((pEVar17->x).pList)->a;
                }
              }
              if (pEVar17->op == 0x98) {
                uVar13 = (uint)pEVar17->iColumn;
                if (pEVar17->iColumn < 0) {
                  uVar13 = (uint)pTVar14->iPKey;
                }
                else if (pTVar14->aCol[uVar13].notNull == '\0') {
                  pIVar15->field_0x63 = pIVar15->field_0x63 & 0xf7;
                }
                pIVar15->aiColumn[(long)local_e8] = (i16)uVar13;
              }
              else {
                if (pTVar14 == pParse->pNewTable) {
                  sqlite3ErrorMsg(pParse,
                                  "expressions prohibited in PRIMARY KEY and UNIQUE constraints");
                  goto LAB_0014e51a;
                }
                if (pIVar15->aColExpr == (ExprList *)0x0) {
                  pEVar21 = sqlite3ExprListDup(db,local_c8,0);
                  pIVar15->aColExpr = pEVar21;
                  if (db->mallocFailed == '\0') {
                    local_d0 = pEVar21->a + (long)local_e8;
                  }
                }
                pIVar15->aiColumn[(long)local_e8] = -2;
                pIVar15->field_0x63 = pIVar15->field_0x63 & 0xf7;
                uVar13 = 0xfffffffe;
              }
              if (local_d0->pExpr->op == '^') {
                pcVar31 = (local_d0->pExpr->u).zToken;
                if (pcVar31 == (char *)0x0) {
                  sVar18 = 1;
                }
                else {
                  sVar18 = strlen(pcVar31);
                  sVar18 = (ulong)((uint)sVar18 & 0x3fffffff) + 1;
                }
                memcpy(local_b8,pcVar31,sVar18);
                zExtra = local_b8 + sVar18;
                local_e0 = local_b8;
                local_b8 = zExtra;
              }
              else if ((int)uVar13 < 0) {
                local_e0 = (char *)0x0;
              }
              else {
                local_e0 = pTVar14->aCol[uVar13].zColl;
              }
              if (local_e0 == (char *)0x0) {
                local_e0 = "BINARY";
              }
              if (((db->init).busy == '\0') &&
                 (pCVar22 = sqlite3LocateCollSeq(pParse,local_e0), pCVar22 == (CollSeq *)0x0)) {
                bVar8 = false;
              }
              else {
                uVar9 = '\0';
                pIVar15->azColl[(long)local_e8] = local_e0;
                if (3 < bVar2) {
                  uVar9 = (u8)*(undefined4 *)&local_d0->sortOrder;
                }
                pIVar15->aSortOrder[(long)local_e8] = uVar9;
                bVar8 = true;
              }
            }
            else {
LAB_0014e51a:
              bVar8 = false;
            }
            if (!bVar8) goto LAB_0014de6f;
            local_e8 = (Vdbe *)((long)local_e8 + 1);
            local_d0 = local_d0 + 1;
          } while ((long)local_e8 < (long)local_c8->nExpr);
        }
        if (pIVar34 == (Index *)0x0) {
          pIVar15->aiColumn[(ulong)local_e8 & 0xffffffff] = -1;
          pIVar15->azColl[(ulong)local_e8 & 0xffffffff] = "BINARY";
        }
        else if (pIVar34->nKeyCol != 0) {
          uVar23 = 0;
          do {
            uVar13 = (uint)pIVar15->nKeyCol;
            psVar32 = pIVar15->aiColumn;
            do {
              if ((int)uVar13 < 1) {
                iVar10 = (int)local_e8;
                pIVar15->aiColumn[iVar10] = pIVar34->aiColumn[uVar23];
                pIVar15->azColl[iVar10] = pIVar34->azColl[uVar23];
                pIVar15->aSortOrder[iVar10] = pIVar34->aSortOrder[uVar23];
                local_e8 = (Vdbe *)(ulong)(iVar10 + 1);
                goto LAB_0014e7e1;
              }
              uVar13 = uVar13 - 1;
              sVar4 = *psVar32;
              psVar32 = psVar32 + 1;
            } while (sVar4 != pIVar34->aiColumn[uVar23]);
            pIVar15->nColumn = pIVar15->nColumn - 1;
LAB_0014e7e1:
            uVar23 = uVar23 + 1;
          } while (uVar23 < pIVar34->nKeyCol);
        }
        sqlite3DefaultRowEst(pIVar15);
        if (pParse->pNewTable == (Table *)0x0) {
          estimateIndexWidth(pIVar15);
        }
        if ((pTblName != (SrcList *)0x0) &&
           (uVar5 = pIVar15->nColumn, (int)pTVar14->nCol <= (int)(uint)uVar5)) {
          bVar2 = pIVar15->field_0x63;
          pIVar15->field_0x63 = bVar2 | 0x20;
          if (0 < pTVar14->nCol) {
            iVar10 = 0;
            do {
              if (iVar10 != pTVar14->iPKey) {
                if ((ulong)uVar5 != 0) {
                  uVar23 = 0;
                  while (pIVar15->aiColumn[uVar23] != (short)iVar10) {
                    uVar23 = uVar23 + 1;
                    if (uVar5 == uVar23) goto LAB_0014e894;
                  }
                  if (-1 < (short)uVar23) goto LAB_0014e88c;
                }
LAB_0014e894:
                pIVar15->field_0x63 = bVar2 & 0xdf;
                break;
              }
LAB_0014e88c:
              iVar10 = iVar10 + 1;
            } while (iVar10 != pTVar14->nCol);
          }
        }
        if ((pTVar14 == pParse->pNewTable) && (pIVar34 = pTVar14->pIndex, pIVar34 != (Index *)0x0))
        {
          do {
            local_b0 = 0x14;
            uVar13 = (uint)pIVar34->nKeyCol;
            if (pIVar34->nKeyCol == pIVar15->nKeyCol) {
              local_b0 = 0;
              uVar23 = 0;
              if (uVar13 != 0) {
                piVar6 = pIVar34->aiColumn;
                piVar7 = pIVar15->aiColumn;
                uVar23 = 0;
                do {
                  if ((piVar6[uVar23] != piVar7[uVar23]) ||
                     (iVar10 = sqlite3StrICmp(pIVar34->azColl[uVar23],pIVar15->azColl[uVar23]),
                     iVar10 != 0)) goto LAB_0014e99e;
                  uVar23 = uVar23 + 1;
                } while (uVar13 != uVar23);
                uVar23 = (ulong)uVar13;
              }
LAB_0014e99e:
              if ((uint)uVar23 == uVar13) {
                if (pIVar34->onError != pIVar15->onError) {
                  if ((pIVar34->onError != '\n') && (pIVar15->onError != '\n')) {
                    sqlite3ErrorMsg(pParse,"conflicting ON CONFLICT clauses specified",0);
                  }
                  if (pIVar34->onError == '\n') {
                    pIVar34->onError = pIVar15->onError;
                  }
                }
                local_b0 = 2;
                if (idxType == '\x02') {
                  pIVar34->field_0x63 = pIVar34->field_0x63 & 0xfc | 2;
                }
              }
            }
            if ((local_b0 != 0x14) && (local_b0 != 0)) goto LAB_0014ea15;
            pIVar34 = pIVar34->pNext;
          } while (pIVar34 != (Index *)0x0);
          local_b0 = 0;
LAB_0014ea15:
          if (local_b0 == 0) goto LAB_0014e8a9;
        }
        else {
LAB_0014e8a9:
          if ((db->init).busy == '\0') {
            if ((pTblName != (SrcList *)0x0) || ((pTVar14->tabFlags & 0x20) == 0)) {
              uVar13 = pParse->nMem + 1;
              pParse->nMem = uVar13;
              local_e8 = pParse->pVdbe;
              if (local_e8 == (Vdbe *)0x0) {
                local_e8 = allocVdbe(pParse);
              }
              if (local_e8 == (Vdbe *)0x0) goto LAB_0014ec6f;
              sqlite3BeginWriteOperation(pParse,1,uVar11);
              local_e0 = (char *)0x0;
              iVar10 = sqlite3VdbeAddOp3(local_e8,0xa6,0,0,0);
              pIVar15->tnum = iVar10;
              sqlite3VdbeAddOp3(local_e8,0x86,uVar11,uVar13,0);
              if (pStart != (Token *)0x0) {
                iVar10 = (*(int *)&(pParse->sLastToken).z - (int)local_78->z) +
                         (pParse->sLastToken).n;
                pcVar31 = " UNIQUE";
                if (onError == 0) {
                  pcVar31 = "";
                }
                local_e0 = sqlite3MPrintf(db,"CREATE%s INDEX %.*s",pcVar31,
                                          (ulong)(iVar10 - (uint)(local_78->z[(long)iVar10 + -1] ==
                                                                 ';')));
              }
              sqlite3NestedParse(pParse,"INSERT INTO %Q.%s VALUES(\'index\',%Q,%Q,#%d,%Q);",
                                 *(undefined8 *)((long)&db->aDb->zDbSName + local_80),
                                 "sqlite_master",pIVar15->zName,pTVar14->zName,(ulong)uVar13,
                                 local_e0);
              if (local_e0 != (char *)0x0) {
                sqlite3DbFreeNN(db,local_e0);
              }
              if (pTblName != (SrcList *)0x0) {
                sqlite3RefillIndex(pParse,pIVar15,uVar13);
                sqlite3ChangeCookie(pParse,uVar11);
                pcVar31 = sqlite3MPrintf(db,"name=\'%q\' AND type=\'index\'",pIVar15->zName);
                sqlite3VdbeAddParseSchemaOp(local_e8,uVar11,pcVar31);
                sqlite3VdbeAddOp3(local_e8,0x97,0,0,0);
              }
              if (local_e8->db->mallocFailed == '\0') {
                iVar10 = local_e8->nOp + -1;
                if (-1 < pIVar15->tnum) {
                  iVar10 = pIVar15->tnum;
                }
                pOVar26 = local_e8->aOp + iVar10;
              }
              else {
                pOVar26 = (Op *)&sqlite3VdbeGetOp_dummy;
              }
              pOVar26->p2 = local_e8->nOp;
            }
          }
          else {
            pvVar24 = sqlite3HashInsert(&pIVar15->pSchema->idxHash,pIVar15->zName,pIVar15);
            if (pvVar24 == (void *)0x0) {
              pbVar1 = (byte *)((long)&db->flags + 2);
              *pbVar1 = *pbVar1 | 0x80;
              if (pTblName != (SrcList *)0x0) {
                pIVar15->tnum = (db->init).newTnum;
              }
            }
            else if ((db->mallocFailed == '\0') && (db->bBenignMalloc == '\0')) {
              db->mallocFailed = '\x01';
              if (0 < db->nVdbeExec) {
                (db->u1).isInterrupted = 1;
              }
              (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
            }
            if (pvVar24 != (void *)0x0) goto LAB_0014ec6f;
          }
          if ((pTblName == (SrcList *)0x0) || ((db->init).busy != '\0')) {
            if ((onError == 5) &&
               ((pIVar34 = pTVar14->pIndex, pIVar34 != (Index *)0x0 && (pIVar34->onError != '\x05'))
               )) {
              do {
                pIVar25 = pIVar34;
                pIVar34 = pIVar25->pNext;
                if (pIVar34 == (Index *)0x0) break;
              } while (pIVar34->onError != '\x05');
              pIVar15->pNext = pIVar34;
              pIVar25->pNext = pIVar15;
            }
            else {
              pIVar15->pNext = pTVar14->pIndex;
              pTVar14->pIndex = pIVar15;
            }
            pIVar15 = (Index *)0x0;
          }
        }
LAB_0014ec6f:
        pPIWhere = (Expr *)0x0;
        goto LAB_0014de6f;
      }
      zName = sqlite3NameFromToken(db,pName);
      if (zName == (char *)0x0) goto LAB_0014de69;
      iVar10 = sqlite3CheckObjectName(pParse,zName);
      if (iVar10 == 0) {
        if (((db->init).busy == '\0') &&
           (pTVar16 = sqlite3FindTable(db,zName,(char *)0x0), pTVar16 != (Table *)0x0)) {
          pcVar31 = "there is already a table named %s";
        }
        else {
          pIVar15 = sqlite3FindIndex(db,zName,pDVar29->zDbSName);
          if (pIVar15 == (Index *)0x0) goto LAB_0014e1ca;
          if (ifNotExist != 0) {
            sqlite3CodeVerifySchema(pParse,uVar11);
            goto LAB_0014de6c;
          }
          pcVar31 = "index %s already exists";
        }
        pIVar15 = (Index *)0x0;
        sqlite3ErrorMsg(pParse,pcVar31,zName);
        goto LAB_0014de6f;
      }
    }
    else {
      pcVar31 = "views may not be indexed";
LAB_0014e0a8:
      zName = (char *)0x0;
      sqlite3ErrorMsg(pParse,pcVar31);
    }
  }
  else {
    uVar11 = sqlite3TwoPartName(pParse,pName1,pName2,&pName);
    if ((int)uVar11 < 0) goto LAB_0014de69;
    uVar23 = (ulong)uVar11;
    if ((((db->init).busy == '\0') &&
        (pTVar14 = sqlite3SrcListLookup(pParse,pTblName), pTVar14 != (Table *)0x0 && pName2->n == 0)
        ) && (pTVar14->pSchema == db->aDb[1].pSchema)) {
      uVar23 = 1;
    }
    pDVar29 = pParse->db->aDb;
    uVar11 = (uint)uVar23;
    sFix.zDb = pDVar29[(int)uVar11].zDbSName;
    sFix.pSchema = pDVar29[(int)uVar11].pSchema;
    sFix.zType = "index";
    sFix.pName = pName;
    sFix.bVarOnly = (int)(uVar11 == 1);
    sFix.pParse = pParse;
    sqlite3FixSrcList(&sFix,pTblName);
    zName = (char *)0x0;
    pTVar14 = sqlite3LocateTableItem(pParse,0,pTblName->a);
    if (pTVar14 == (Table *)0x0) goto LAB_0014de6c;
    if ((uVar11 != 1) || (db->aDb[1].pSchema == pTVar14->pSchema)) {
      if ((pTVar14->tabFlags & 0x20) != 0) {
        for (pIVar34 = pTVar14->pIndex;
            (pIVar34 != (Index *)0x0 && ((pIVar34->field_0x63 & 3) != 2)); pIVar34 = pIVar34->pNext)
        {
        }
        goto LAB_0014e04d;
      }
      goto LAB_0014e04a;
    }
    pcVar31 = pTVar14->zName;
    pcVar30 = "cannot create a TEMP index on non-TEMP table \"%s\"";
LAB_0014e0e8:
    zName = (char *)0x0;
    sqlite3ErrorMsg(pParse,pcVar30,pcVar31);
  }
LAB_0014de6c:
  pIVar15 = (Index *)0x0;
LAB_0014de6f:
  if (pIVar15 != (Index *)0x0) {
    freeIndex(db,pIVar15);
  }
  if (pPIWhere != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pPIWhere);
  }
  if (local_c8 != (ExprList *)0x0) {
    exprListDeleteNN(db,local_c8);
  }
  sqlite3SrcListDelete(db,pTblName);
  if (zName != (char *)0x0) {
    sqlite3DbFreeNN(db,zName);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateIndex(
  Parse *pParse,     /* All information about this parse */
  Token *pName1,     /* First part of index name. May be NULL */
  Token *pName2,     /* Second part of index name. May be NULL */
  SrcList *pTblName, /* Table to index. Use pParse->pNewTable if 0 */
  ExprList *pList,   /* A list of columns to be indexed */
  int onError,       /* OE_Abort, OE_Ignore, OE_Replace, or OE_None */
  Token *pStart,     /* The CREATE token that begins this statement */
  Expr *pPIWhere,    /* WHERE clause for partial indices */
  int sortOrder,     /* Sort order of primary key when pList==NULL */
  int ifNotExist,    /* Omit error if index already exists */
  u8 idxType         /* The index type */
){
  Table *pTab = 0;     /* Table to be indexed */
  Index *pIndex = 0;   /* The index to be created */
  char *zName = 0;     /* Name of the index */
  int nName;           /* Number of characters in zName */
  int i, j;
  DbFixer sFix;        /* For assigning database names to pTable */
  int sortOrderMask;   /* 1 to honor DESC in index.  0 to ignore. */
  sqlite3 *db = pParse->db;
  Db *pDb;             /* The specific table containing the indexed database */
  int iDb;             /* Index of the database that is being written */
  Token *pName = 0;    /* Unqualified name of the index to create */
  struct ExprList_item *pListItem; /* For looping over pList */
  int nExtra = 0;                  /* Space allocated for zExtra[] */
  int nExtraCol;                   /* Number of extra columns needed */
  char *zExtra = 0;                /* Extra space after the Index object */
  Index *pPk = 0;      /* PRIMARY KEY index for WITHOUT ROWID tables */

  if( db->mallocFailed || pParse->nErr>0 ){
    goto exit_create_index;
  }
  if( IN_DECLARE_VTAB && idxType!=SQLITE_IDXTYPE_PRIMARYKEY ){
    goto exit_create_index;
  }
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto exit_create_index;
  }

  /*
  ** Find the table that is to be indexed.  Return early if not found.
  */
  if( pTblName!=0 ){

    /* Use the two-part index name to determine the database 
    ** to search for the table. 'Fix' the table name to this db
    ** before looking up the table.
    */
    assert( pName1 && pName2 );
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ) goto exit_create_index;
    assert( pName && pName->z );

#ifndef SQLITE_OMIT_TEMPDB
    /* If the index name was unqualified, check if the table
    ** is a temp table. If so, set the database to 1. Do not do this
    ** if initialising a database schema.
    */
    if( !db->init.busy ){
      pTab = sqlite3SrcListLookup(pParse, pTblName);
      if( pName2->n==0 && pTab && pTab->pSchema==db->aDb[1].pSchema ){
        iDb = 1;
      }
    }
#endif

    sqlite3FixInit(&sFix, pParse, iDb, "index", pName);
    if( sqlite3FixSrcList(&sFix, pTblName) ){
      /* Because the parser constructs pTblName from a single identifier,
      ** sqlite3FixSrcList can never fail. */
      assert(0);
    }
    pTab = sqlite3LocateTableItem(pParse, 0, &pTblName->a[0]);
    assert( db->mallocFailed==0 || pTab==0 );
    if( pTab==0 ) goto exit_create_index;
    if( iDb==1 && db->aDb[iDb].pSchema!=pTab->pSchema ){
      sqlite3ErrorMsg(pParse, 
           "cannot create a TEMP index on non-TEMP table \"%s\"",
           pTab->zName);
      goto exit_create_index;
    }
    if( !HasRowid(pTab) ) pPk = sqlite3PrimaryKeyIndex(pTab);
  }else{
    assert( pName==0 );
    assert( pStart==0 );
    pTab = pParse->pNewTable;
    if( !pTab ) goto exit_create_index;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  }
  pDb = &db->aDb[iDb];

  assert( pTab!=0 );
  assert( pParse->nErr==0 );
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 
       && db->init.busy==0
#if SQLITE_USER_AUTHENTICATION
       && sqlite3UserAuthTable(pTab->zName)==0
#endif
       && sqlite3StrNICmp(&pTab->zName[7],"altertab_",9)!=0 ){
    sqlite3ErrorMsg(pParse, "table %s may not be indexed", pTab->zName);
    goto exit_create_index;
  }
#ifndef SQLITE_OMIT_VIEW
  if( pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "views may not be indexed");
    goto exit_create_index;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be indexed");
    goto exit_create_index;
  }
#endif

  /*
  ** Find the name of the index.  Make sure there is not already another
  ** index or table with the same name.  
  **
  ** Exception:  If we are reading the names of permanent indices from the
  ** sqlite_master table (because some other process changed the schema) and
  ** one of the index names collides with the name of a temporary table or
  ** index, then we will continue to process this index.
  **
  ** If pName==0 it means that we are
  ** dealing with a primary key or UNIQUE constraint.  We have to invent our
  ** own name.
  */
  if( pName ){
    zName = sqlite3NameFromToken(db, pName);
    if( zName==0 ) goto exit_create_index;
    assert( pName->z!=0 );
    if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){
      goto exit_create_index;
    }
    if( !db->init.busy ){
      if( sqlite3FindTable(db, zName, 0)!=0 ){
        sqlite3ErrorMsg(pParse, "there is already a table named %s", zName);
        goto exit_create_index;
      }
    }
    if( sqlite3FindIndex(db, zName, pDb->zDbSName)!=0 ){
      if( !ifNotExist ){
        sqlite3ErrorMsg(pParse, "index %s already exists", zName);
      }else{
        assert( !db->init.busy );
        sqlite3CodeVerifySchema(pParse, iDb);
      }
      goto exit_create_index;
    }
  }else{
    int n;
    Index *pLoop;
    for(pLoop=pTab->pIndex, n=1; pLoop; pLoop=pLoop->pNext, n++){}
    zName = sqlite3MPrintf(db, "sqlite_autoindex_%s_%d", pTab->zName, n);
    if( zName==0 ){
      goto exit_create_index;
    }

    /* Automatic index names generated from within sqlite3_declare_vtab()
    ** must have names that are distinct from normal automatic index names.
    ** The following statement converts "sqlite3_autoindex..." into
    ** "sqlite3_butoindex..." in order to make the names distinct.
    ** The "vtab_err.test" test demonstrates the need of this statement. */
    if( IN_DECLARE_VTAB ) zName[7]++;
  }

  /* Check for authorization to create an index.
  */
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    const char *zDb = pDb->zDbSName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iDb), 0, zDb) ){
      goto exit_create_index;
    }
    i = SQLITE_CREATE_INDEX;
    if( !OMIT_TEMPDB && iDb==1 ) i = SQLITE_CREATE_TEMP_INDEX;
    if( sqlite3AuthCheck(pParse, i, zName, pTab->zName, zDb) ){
      goto exit_create_index;
    }
  }
#endif

  /* If pList==0, it means this routine was called to make a primary
  ** key out of the last column added to the table under construction.
  ** So create a fake list to simulate this.
  */
  if( pList==0 ){
    Token prevCol;
    sqlite3TokenInit(&prevCol, pTab->aCol[pTab->nCol-1].zName);
    pList = sqlite3ExprListAppend(pParse, 0,
              sqlite3ExprAlloc(db, TK_ID, &prevCol, 0));
    if( pList==0 ) goto exit_create_index;
    assert( pList->nExpr==1 );
    sqlite3ExprListSetSortOrder(pList, sortOrder);
  }else{
    sqlite3ExprListCheckLength(pParse, pList, "index");
  }

  /* Figure out how many bytes of space are required to store explicitly
  ** specified collation sequence names.
  */
  for(i=0; i<pList->nExpr; i++){
    Expr *pExpr = pList->a[i].pExpr;
    assert( pExpr!=0 );
    if( pExpr->op==TK_COLLATE ){
      nExtra += (1 + sqlite3Strlen30(pExpr->u.zToken));
    }
  }

  /* 
  ** Allocate the index structure. 
  */
  nName = sqlite3Strlen30(zName);
  nExtraCol = pPk ? pPk->nKeyCol : 1;
  pIndex = sqlite3AllocateIndexObject(db, pList->nExpr + nExtraCol,
                                      nName + nExtra + 1, &zExtra);
  if( db->mallocFailed ){
    goto exit_create_index;
  }
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->aiRowLogEst) );
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->azColl) );
  pIndex->zName = zExtra;
  zExtra += nName + 1;
  memcpy(pIndex->zName, zName, nName+1);
  pIndex->pTable = pTab;
  pIndex->onError = (u8)onError;
  pIndex->uniqNotNull = onError!=OE_None;
  pIndex->idxType = idxType;
  pIndex->pSchema = db->aDb[iDb].pSchema;
  pIndex->nKeyCol = pList->nExpr;
  if( pPIWhere ){
    sqlite3ResolveSelfReference(pParse, pTab, NC_PartIdx, pPIWhere, 0);
    pIndex->pPartIdxWhere = pPIWhere;
    pPIWhere = 0;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );

  /* Check to see if we should honor DESC requests on index columns
  */
  if( pDb->pSchema->file_format>=4 ){
    sortOrderMask = -1;   /* Honor DESC */
  }else{
    sortOrderMask = 0;    /* Ignore DESC */
  }

  /* Analyze the list of expressions that form the terms of the index and
  ** report any errors.  In the common case where the expression is exactly
  ** a table column, store that column in aiColumn[].  For general expressions,
  ** populate pIndex->aColExpr and store XN_EXPR (-2) in aiColumn[].
  **
  ** TODO: Issue a warning if two or more columns of the index are identical.
  ** TODO: Issue a warning if the table primary key is used as part of the
  ** index key.
  */
  for(i=0, pListItem=pList->a; i<pList->nExpr; i++, pListItem++){
    Expr *pCExpr;                  /* The i-th index expression */
    int requestedSortOrder;        /* ASC or DESC on the i-th expression */
    const char *zColl;             /* Collation sequence name */

    sqlite3StringToId(pListItem->pExpr);
    sqlite3ResolveSelfReference(pParse, pTab, NC_IdxExpr, pListItem->pExpr, 0);
    if( pParse->nErr ) goto exit_create_index;
    pCExpr = sqlite3ExprSkipCollate(pListItem->pExpr);
    if( pCExpr->op!=TK_COLUMN ){
      if( pTab==pParse->pNewTable ){
        sqlite3ErrorMsg(pParse, "expressions prohibited in PRIMARY KEY and "
                                "UNIQUE constraints");
        goto exit_create_index;
      }
      if( pIndex->aColExpr==0 ){
        ExprList *pCopy = sqlite3ExprListDup(db, pList, 0);
        pIndex->aColExpr = pCopy;
        if( !db->mallocFailed ){
          assert( pCopy!=0 );
          pListItem = &pCopy->a[i];
        }
      }
      j = XN_EXPR;
      pIndex->aiColumn[i] = XN_EXPR;
      pIndex->uniqNotNull = 0;
    }else{
      j = pCExpr->iColumn;
      assert( j<=0x7fff );
      if( j<0 ){
        j = pTab->iPKey;
      }else if( pTab->aCol[j].notNull==0 ){
        pIndex->uniqNotNull = 0;
      }
      pIndex->aiColumn[i] = (i16)j;
    }
    zColl = 0;
    if( pListItem->pExpr->op==TK_COLLATE ){
      int nColl;
      zColl = pListItem->pExpr->u.zToken;
      nColl = sqlite3Strlen30(zColl) + 1;
      assert( nExtra>=nColl );
      memcpy(zExtra, zColl, nColl);
      zColl = zExtra;
      zExtra += nColl;
      nExtra -= nColl;
    }else if( j>=0 ){
      zColl = pTab->aCol[j].zColl;
    }
    if( !zColl ) zColl = sqlite3StrBINARY;
    if( !db->init.busy && !sqlite3LocateCollSeq(pParse, zColl) ){
      goto exit_create_index;
    }
    pIndex->azColl[i] = zColl;
    requestedSortOrder = pListItem->sortOrder & sortOrderMask;
    pIndex->aSortOrder[i] = (u8)requestedSortOrder;
  }

  /* Append the table key to the end of the index.  For WITHOUT ROWID
  ** tables (when pPk!=0) this will be the declared PRIMARY KEY.  For
  ** normal tables (when pPk==0) this will be the rowid.
  */
  if( pPk ){
    for(j=0; j<pPk->nKeyCol; j++){
      int x = pPk->aiColumn[j];
      assert( x>=0 );
      if( hasColumn(pIndex->aiColumn, pIndex->nKeyCol, x) ){
        pIndex->nColumn--; 
      }else{
        pIndex->aiColumn[i] = x;
        pIndex->azColl[i] = pPk->azColl[j];
        pIndex->aSortOrder[i] = pPk->aSortOrder[j];
        i++;
      }
    }
    assert( i==pIndex->nColumn );
  }else{
    pIndex->aiColumn[i] = XN_ROWID;
    pIndex->azColl[i] = sqlite3StrBINARY;
  }
  sqlite3DefaultRowEst(pIndex);
  if( pParse->pNewTable==0 ) estimateIndexWidth(pIndex);

  /* If this index contains every column of its table, then mark
  ** it as a covering index */
  assert( HasRowid(pTab) 
      || pTab->iPKey<0 || sqlite3ColumnOfIndex(pIndex, pTab->iPKey)>=0 );
  if( pTblName!=0 && pIndex->nColumn>=pTab->nCol ){
    pIndex->isCovering = 1;
    for(j=0; j<pTab->nCol; j++){
      if( j==pTab->iPKey ) continue;
      if( sqlite3ColumnOfIndex(pIndex,j)>=0 ) continue;
      pIndex->isCovering = 0;
      break;
    }
  }

  if( pTab==pParse->pNewTable ){
    /* This routine has been called to create an automatic index as a
    ** result of a PRIMARY KEY or UNIQUE clause on a column definition, or
    ** a PRIMARY KEY or UNIQUE clause following the column definitions.
    ** i.e. one of:
    **
    ** CREATE TABLE t(x PRIMARY KEY, y);
    ** CREATE TABLE t(x, y, UNIQUE(x, y));
    **
    ** Either way, check to see if the table already has such an index. If
    ** so, don't bother creating this one. This only applies to
    ** automatically created indices. Users can do as they wish with
    ** explicit indices.
    **
    ** Two UNIQUE or PRIMARY KEY constraints are considered equivalent
    ** (and thus suppressing the second one) even if they have different
    ** sort orders.
    **
    ** If there are different collating sequences or if the columns of
    ** the constraint occur in different orders, then the constraints are
    ** considered distinct and both result in separate indices.
    */
    Index *pIdx;
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      int k;
      assert( IsUniqueIndex(pIdx) );
      assert( pIdx->idxType!=SQLITE_IDXTYPE_APPDEF );
      assert( IsUniqueIndex(pIndex) );

      if( pIdx->nKeyCol!=pIndex->nKeyCol ) continue;
      for(k=0; k<pIdx->nKeyCol; k++){
        const char *z1;
        const char *z2;
        assert( pIdx->aiColumn[k]>=0 );
        if( pIdx->aiColumn[k]!=pIndex->aiColumn[k] ) break;
        z1 = pIdx->azColl[k];
        z2 = pIndex->azColl[k];
        if( sqlite3StrICmp(z1, z2) ) break;
      }
      if( k==pIdx->nKeyCol ){
        if( pIdx->onError!=pIndex->onError ){
          /* This constraint creates the same index as a previous
          ** constraint specified somewhere in the CREATE TABLE statement.
          ** However the ON CONFLICT clauses are different. If both this 
          ** constraint and the previous equivalent constraint have explicit
          ** ON CONFLICT clauses this is an error. Otherwise, use the
          ** explicitly specified behavior for the index.
          */
          if( !(pIdx->onError==OE_Default || pIndex->onError==OE_Default) ){
            sqlite3ErrorMsg(pParse, 
                "conflicting ON CONFLICT clauses specified", 0);
          }
          if( pIdx->onError==OE_Default ){
            pIdx->onError = pIndex->onError;
          }
        }
        if( idxType==SQLITE_IDXTYPE_PRIMARYKEY ) pIdx->idxType = idxType;
        goto exit_create_index;
      }
    }
  }

  /* Link the new Index structure to its table and to the other
  ** in-memory database structures. 
  */
  assert( pParse->nErr==0 );
  if( db->init.busy ){
    Index *p;
    assert( !IN_DECLARE_VTAB );
    assert( sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
    p = sqlite3HashInsert(&pIndex->pSchema->idxHash, 
                          pIndex->zName, pIndex);
    if( p ){
      assert( p==pIndex );  /* Malloc must have failed */
      sqlite3OomFault(db);
      goto exit_create_index;
    }
    db->flags |= SQLITE_InternChanges;
    if( pTblName!=0 ){
      pIndex->tnum = db->init.newTnum;
    }
  }

  /* If this is the initial CREATE INDEX statement (or CREATE TABLE if the
  ** index is an implied index for a UNIQUE or PRIMARY KEY constraint) then
  ** emit code to allocate the index rootpage on disk and make an entry for
  ** the index in the sqlite_master table and populate the index with
  ** content.  But, do not do this if we are simply reading the sqlite_master
  ** table to parse the schema, or if this index is the PRIMARY KEY index
  ** of a WITHOUT ROWID table.
  **
  ** If pTblName==0 it means this index is generated as an implied PRIMARY KEY
  ** or UNIQUE index in a CREATE TABLE statement.  Since the table
  ** has just been created, it contains no data and the index initialization
  ** step can be skipped.
  */
  else if( HasRowid(pTab) || pTblName!=0 ){
    Vdbe *v;
    char *zStmt;
    int iMem = ++pParse->nMem;

    v = sqlite3GetVdbe(pParse);
    if( v==0 ) goto exit_create_index;

    sqlite3BeginWriteOperation(pParse, 1, iDb);

    /* Create the rootpage for the index using CreateIndex. But before
    ** doing so, code a Noop instruction and store its address in 
    ** Index.tnum. This is required in case this index is actually a 
    ** PRIMARY KEY and the table is actually a WITHOUT ROWID table. In 
    ** that case the convertToWithoutRowidTable() routine will replace
    ** the Noop with a Goto to jump over the VDBE code generated below. */
    pIndex->tnum = sqlite3VdbeAddOp0(v, OP_Noop);
    sqlite3VdbeAddOp2(v, OP_CreateIndex, iDb, iMem);

    /* Gather the complete text of the CREATE INDEX statement into
    ** the zStmt variable
    */
    if( pStart ){
      int n = (int)(pParse->sLastToken.z - pName->z) + pParse->sLastToken.n;
      if( pName->z[n-1]==';' ) n--;
      /* A named index with an explicit CREATE INDEX statement */
      zStmt = sqlite3MPrintf(db, "CREATE%s INDEX %.*s",
        onError==OE_None ? "" : " UNIQUE", n, pName->z);
    }else{
      /* An automatic index created by a PRIMARY KEY or UNIQUE constraint */
      /* zStmt = sqlite3MPrintf(""); */
      zStmt = 0;
    }

    /* Add an entry in sqlite_master for this index
    */
    sqlite3NestedParse(pParse, 
        "INSERT INTO %Q.%s VALUES('index',%Q,%Q,#%d,%Q);",
        db->aDb[iDb].zDbSName, MASTER_NAME,
        pIndex->zName,
        pTab->zName,
        iMem,
        zStmt
    );
    sqlite3DbFree(db, zStmt);

    /* Fill the index with data and reparse the schema. Code an OP_Expire
    ** to invalidate all pre-compiled statements.
    */
    if( pTblName ){
      sqlite3RefillIndex(pParse, pIndex, iMem);
      sqlite3ChangeCookie(pParse, iDb);
      sqlite3VdbeAddParseSchemaOp(v, iDb,
         sqlite3MPrintf(db, "name='%q' AND type='index'", pIndex->zName));
      sqlite3VdbeAddOp0(v, OP_Expire);
    }

    sqlite3VdbeJumpHere(v, pIndex->tnum);
  }

  /* When adding an index to the list of indices for a table, make
  ** sure all indices labeled OE_Replace come after all those labeled
  ** OE_Ignore.  This is necessary for the correct constraint check
  ** processing (in sqlite3GenerateConstraintChecks()) as part of
  ** UPDATE and INSERT statements.  
  */
  if( db->init.busy || pTblName==0 ){
    if( onError!=OE_Replace || pTab->pIndex==0
         || pTab->pIndex->onError==OE_Replace){
      pIndex->pNext = pTab->pIndex;
      pTab->pIndex = pIndex;
    }else{
      Index *pOther = pTab->pIndex;
      while( pOther->pNext && pOther->pNext->onError!=OE_Replace ){
        pOther = pOther->pNext;
      }
      pIndex->pNext = pOther->pNext;
      pOther->pNext = pIndex;
    }
    pIndex = 0;
  }

  /* Clean up before exiting */
exit_create_index:
  if( pIndex ) freeIndex(db, pIndex);
  sqlite3ExprDelete(db, pPIWhere);
  sqlite3ExprListDelete(db, pList);
  sqlite3SrcListDelete(db, pTblName);
  sqlite3DbFree(db, zName);
}